

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O1

Mat * __thiscall
ncnn::ModelBinFromStdio::load(Mat *__return_storage_ptr__,ModelBinFromStdio *this,int w,int type)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  void *pvVar4;
  void *pvVar5;
  char *pcVar6;
  ulong uVar7;
  size_t sVar8;
  size_type __new_size;
  int *piVar9;
  anon_union_4_2_77b30072 flag_struct;
  Mat m;
  vector<unsigned_char,_std::allocator<unsigned_char>_> index_array;
  vector<unsigned_short,_std::allocator<unsigned_short>_> float16_weights;
  uint local_49c;
  void *local_498;
  int *piStack_490;
  size_t local_488;
  Allocator *local_480;
  int local_478;
  int iStack_474;
  undefined4 uStack_470;
  int iStack_46c;
  size_t local_468;
  uint local_460;
  uint local_45c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_458;
  vector<signed_char,_std::allocator<signed_char>_> local_438 [43];
  
  if ((FILE *)this->binfp == (FILE *)0x0) {
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->c = 0;
    __return_storage_ptr__->elemsize = 0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    goto LAB_00131cca;
  }
  if (type != 1) {
    if (type == 0) {
      sVar3 = fread(&local_49c,4,1,(FILE *)this->binfp);
      uVar2 = local_49c;
      if ((int)sVar3 == 1) {
        if (local_49c != 0x2c056) {
          if (local_49c == 0xd4b38) {
            local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            uVar7 = (long)(w + 3) & 0xfffffffffffffffc;
            std::vector<signed_char,_std::allocator<signed_char>_>::resize(local_438,uVar7);
            sVar3 = fread(local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,uVar7,1,(FILE *)this->binfp);
            uVar2 = (uint)sVar3;
            if (uVar2 == 1) {
              __return_storage_ptr__->dims = 0;
              __return_storage_ptr__->data = (void *)0x0;
              __return_storage_ptr__->refcount = (int *)0x0;
              piVar9 = __return_storage_ptr__->refcount;
              if (piVar9 != (int *)0x0) {
                LOCK();
                *piVar9 = *piVar9 + -1;
                UNLOCK();
                if (*piVar9 == 0) {
                  if (__return_storage_ptr__->allocator == (Allocator *)0x0) {
                    if (__return_storage_ptr__->data != (void *)0x0) {
                      free(*(void **)((long)__return_storage_ptr__->data + -8));
                    }
                  }
                  else {
                    (**(code **)(*(long *)__return_storage_ptr__->allocator + 8))();
                  }
                }
              }
              sVar3 = (size_t)w;
              __return_storage_ptr__->data = (void *)0x0;
              __return_storage_ptr__->refcount = (int *)0x0;
              __return_storage_ptr__->elemsize = 0;
              __return_storage_ptr__->cstep = 0;
              __return_storage_ptr__->dims = 0;
              __return_storage_ptr__->w = 0;
              __return_storage_ptr__->h = 0;
              __return_storage_ptr__->c = 0;
              __return_storage_ptr__->elemsize = 1;
              __return_storage_ptr__->allocator = (Allocator *)0x0;
              __return_storage_ptr__->dims = 1;
              __return_storage_ptr__->w = w;
              __return_storage_ptr__->h = 1;
              __return_storage_ptr__->c = 1;
              __return_storage_ptr__->cstep = sVar3;
              if (w != 0) {
                uVar7 = sVar3 + 3 & 0xfffffffffffffffc;
                pvVar4 = malloc(uVar7 + 0x1c);
                pvVar5 = (void *)((long)pvVar4 + 0x17U & 0xfffffffffffffff0);
                *(void **)((long)pvVar5 - 8) = pvVar4;
                __return_storage_ptr__->data = pvVar5;
                __return_storage_ptr__->refcount = (int *)((long)pvVar5 + uVar7);
                *(undefined4 *)((long)pvVar5 + uVar7) = 1;
              }
              if ((__return_storage_ptr__->data != (void *)0x0) &&
                 ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0)) {
                memcpy(__return_storage_ptr__->data,
                       local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,sVar3);
              }
              goto LAB_0013224f;
            }
            pcVar6 = "ModelBin read int8_weights failed %d\n";
          }
          else {
            if (local_49c != 0x1306b47) {
              uVar1 = local_49c >> 8;
              local_460 = local_49c >> 0x10 & 0xff;
              local_45c = local_49c >> 0x18;
              local_498 = (void *)0x0;
              piStack_490 = (int *)0x0;
              local_488 = 4;
              local_480 = (Allocator *)0x0;
              local_478 = 1;
              uStack_470 = 1;
              iStack_46c = 1;
              sVar8 = (size_t)w;
              iStack_474 = w;
              local_468 = sVar8;
              if (w != 0) {
                pvVar4 = malloc(sVar8 * 4 + 0x1c);
                local_498 = (void *)((long)pvVar4 + 0x17U & 0xfffffffffffffff0);
                *(void **)((long)local_498 - 8) = pvVar4;
                piStack_490 = (int *)((long)local_498 + sVar8 * 4);
                *piStack_490 = 1;
              }
              if ((local_498 == (void *)0x0) || ((long)iStack_46c * local_468 == 0)) {
                __return_storage_ptr__->data = local_498;
              }
              else {
                if ((uVar1 & 0xff) + (uVar2 & 0xff) + local_460 == 0 && local_45c == 0) {
                  if ((char)local_49c == '\0') {
                    sVar3 = fread(local_498,sVar8 << 2,1,(FILE *)this->binfp);
                    uVar2 = (uint)sVar3;
                    if (uVar2 != 1) {
                      pcVar6 = "ModelBin read weight_data failed %d\n";
                      goto LAB_0013228f;
                    }
                  }
                }
                else {
                  sVar3 = fread(local_438,0x400,1,(FILE *)this->binfp);
                  uVar2 = (uint)sVar3;
                  if (uVar2 != 1) {
                    pcVar6 = "ModelBin read quantization_value failed %d\n";
LAB_0013228f:
                    fprintf(_stderr,pcVar6,(ulong)uVar2);
                    __return_storage_ptr__->data = (void *)0x0;
                    __return_storage_ptr__->refcount = (int *)0x0;
                    __return_storage_ptr__->elemsize = 0;
                    __return_storage_ptr__->allocator = (Allocator *)0x0;
                    __return_storage_ptr__->dims = 0;
                    __return_storage_ptr__->w = 0;
                    __return_storage_ptr__->h = 0;
                    __return_storage_ptr__->c = 0;
                    __return_storage_ptr__->cstep = 0;
                    goto LAB_0013210c;
                  }
                  local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  __new_size = (size_type)(int)(w + 3U & 0xfffffffc);
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_458,__new_size);
                  sVar3 = fread(local_458.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,__new_size,1,
                                (FILE *)this->binfp);
                  if ((int)sVar3 == 1) {
                    if (0 < w) {
                      uVar7 = 0;
                      do {
                        *(undefined4 *)((long)local_498 + uVar7 * 4) =
                             *(undefined4 *)
                              ((long)&local_438[0].
                                      super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                      _M_impl.super__Vector_impl_data._M_start +
                              (ulong)local_458.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar7] * 4);
                        uVar7 = uVar7 + 1;
                      } while ((uint)w != uVar7);
                    }
                  }
                  else {
                    fprintf(_stderr,"ModelBin read index_array failed %d\n",sVar3 & 0xffffffff);
                    __return_storage_ptr__->data = (void *)0x0;
                    __return_storage_ptr__->refcount = (int *)0x0;
                    __return_storage_ptr__->elemsize = 0;
                    __return_storage_ptr__->allocator = (Allocator *)0x0;
                    __return_storage_ptr__->dims = 0;
                    __return_storage_ptr__->w = 0;
                    __return_storage_ptr__->h = 0;
                    __return_storage_ptr__->c = 0;
                    __return_storage_ptr__->cstep = 0;
                  }
                  if (local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_458.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_458.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_458.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if ((int)sVar3 != 1) goto LAB_0013210c;
                }
                __return_storage_ptr__->data = local_498;
              }
              __return_storage_ptr__->refcount = piStack_490;
              __return_storage_ptr__->elemsize = local_488;
              __return_storage_ptr__->allocator = local_480;
              __return_storage_ptr__->dims = local_478;
              if (piStack_490 != (int *)0x0) {
                LOCK();
                *piStack_490 = *piStack_490 + 1;
                UNLOCK();
              }
              __return_storage_ptr__->w = iStack_474;
              __return_storage_ptr__->h = uStack_470;
              __return_storage_ptr__->c = iStack_46c;
              __return_storage_ptr__->cstep = local_468;
LAB_0013210c:
              if (piStack_490 == (int *)0x0) {
                return __return_storage_ptr__;
              }
              LOCK();
              *piStack_490 = *piStack_490 + -1;
              UNLOCK();
              if (*piStack_490 != 0) {
                return __return_storage_ptr__;
              }
              if (local_480 != (Allocator *)0x0) {
                (**(code **)(*(long *)local_480 + 8))();
                return __return_storage_ptr__;
              }
              if (local_498 == (void *)0x0) {
                return __return_storage_ptr__;
              }
              free(*(void **)((long)local_498 + -8));
              return __return_storage_ptr__;
            }
            local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            uVar7 = (long)(((ulong)(uint)w << 0x21) + 0x300000000) >> 0x20 & 0xfffffffffffffffc;
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_438,uVar7);
            sVar3 = fread(local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,uVar7,1,(FILE *)this->binfp);
            uVar2 = (uint)sVar3;
            if (uVar2 == 1) {
              Mat::from_float16(__return_storage_ptr__,
                                (unsigned_short *)
                                local_438[0].
                                super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,w);
              goto LAB_0013224f;
            }
            pcVar6 = "ModelBin read float16_weights failed %d\n";
          }
          fprintf(_stderr,pcVar6,(ulong)uVar2);
          __return_storage_ptr__->data = (void *)0x0;
          __return_storage_ptr__->refcount = (int *)0x0;
          __return_storage_ptr__->elemsize = 0;
          __return_storage_ptr__->allocator = (Allocator *)0x0;
          __return_storage_ptr__->dims = 0;
          __return_storage_ptr__->w = 0;
          __return_storage_ptr__->h = 0;
          __return_storage_ptr__->c = 0;
          __return_storage_ptr__->cstep = 0;
LAB_0013224f:
          if ((unsigned_short *)
              local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_start == (unsigned_short *)0x0) {
            return __return_storage_ptr__;
          }
          operator_delete(local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_438[0].
                                super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_438[0].
                                super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
          return __return_storage_ptr__;
        }
        if (w == 0) {
          piVar9 = (int *)0x0;
          pvVar4 = (void *)0x0;
          goto LAB_00131d0c;
        }
        goto LAB_00131cde;
      }
      pcVar6 = "ModelBin read flag_struct failed %d\n";
      uVar7 = sVar3 & 0xffffffff;
    }
    else {
      pcVar6 = "ModelBin load type %d not implemented\n";
      uVar7 = (ulong)(uint)type;
    }
    fprintf(_stderr,pcVar6,uVar7);
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    __return_storage_ptr__->elemsize = 0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->c = 0;
LAB_00131cca:
    __return_storage_ptr__->cstep = 0;
    return __return_storage_ptr__;
  }
  if (w == 0) {
    pvVar4 = (void *)0x0;
    piVar9 = (int *)0x0;
    goto LAB_00131d0c;
  }
LAB_00131cde:
  pvVar5 = malloc((long)w * 4 + 0x1c);
  pvVar4 = (void *)((long)pvVar5 + 0x17U & 0xfffffffffffffff0);
  *(void **)((long)pvVar4 - 8) = pvVar5;
  piVar9 = (int *)((long)pvVar4 + (long)w * 4);
  *piVar9 = 1;
LAB_00131d0c:
  if ((pvVar4 == (void *)0x0 || w == 0) ||
     (sVar3 = fread(pvVar4,(long)w * 4,1,(FILE *)this->binfp), (int)sVar3 == 1)) {
    __return_storage_ptr__->data = pvVar4;
    __return_storage_ptr__->refcount = piVar9;
    __return_storage_ptr__->elemsize = 4;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->dims = 1;
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + 1;
      UNLOCK();
    }
    __return_storage_ptr__->w = w;
    __return_storage_ptr__->h = 1;
    __return_storage_ptr__->c = 1;
    __return_storage_ptr__->cstep = (long)w;
  }
  else {
    fprintf(_stderr,"ModelBin read weight_data failed %d\n",sVar3 & 0xffffffff);
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    __return_storage_ptr__->elemsize = 0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->c = 0;
    __return_storage_ptr__->cstep = 0;
  }
  if (piVar9 == (int *)0x0) {
    return __return_storage_ptr__;
  }
  LOCK();
  *piVar9 = *piVar9 + -1;
  UNLOCK();
  if (pvVar4 == (void *)0x0 || *piVar9 != 0) {
    return __return_storage_ptr__;
  }
  free(*(void **)((long)pvVar4 + -8));
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBinFromStdio::load(int w, int type) const
{
    if (!binfp)
        return Mat();

    if (type == 0)
    {
        int nread;

        union
        {
            struct
            {
                unsigned char f0;
                unsigned char f1;
                unsigned char f2;
                unsigned char f3;
            };
            unsigned int tag;
        } flag_struct;

        nread = fread(&flag_struct, sizeof(flag_struct), 1, binfp);
        if (nread != 1)
        {
            fprintf(stderr, "ModelBin read flag_struct failed %d\n", nread);
            return Mat();
        }

        unsigned int flag = flag_struct.f0 + flag_struct.f1 + flag_struct.f2 + flag_struct.f3;

        if (flag_struct.tag == 0x01306B47)
        {
            // half-precision data
            int align_data_size = alignSize(w * sizeof(unsigned short), 4);
            std::vector<unsigned short> float16_weights;
            float16_weights.resize(align_data_size);
            nread = fread(float16_weights.data(), align_data_size, 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read float16_weights failed %d\n", nread);
                return Mat();
            }

            return Mat::from_float16(float16_weights.data(), w);
        }
        else if (flag_struct.tag == 0x000D4B38)
        {
            // int8 data
            int align_data_size = alignSize(w, 4);
            std::vector<signed char> int8_weights;
            int8_weights.resize(align_data_size);
            nread = fread(int8_weights.data(), align_data_size, 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read int8_weights failed %d\n", nread);
                return Mat();
            }

            Mat m(w, (size_t)1u);
            if (m.empty())
                return m;

            memcpy(m.data, int8_weights.data(), w);

            return m;
        }
        else if (flag_struct.tag == 0x0002C056)
        {
            Mat m(w);
            if (m.empty())
                return m;

            // raw data with extra scaling
            nread = fread(m, w * sizeof(float), 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read weight_data failed %d\n", nread);
                return Mat();
            }

            return m;
        }

        Mat m(w);
        if (m.empty())
            return m;

        if (flag != 0)
        {
            // quantized data
            float quantization_value[256];
            nread = fread(quantization_value, 256 * sizeof(float), 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read quantization_value failed %d\n", nread);
                return Mat();
            }

            int align_weight_data_size = alignSize(w * sizeof(unsigned char), 4);
            std::vector<unsigned char> index_array;
            index_array.resize(align_weight_data_size);
            nread = fread(index_array.data(), align_weight_data_size, 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read index_array failed %d\n", nread);
                return Mat();
            }

            float* ptr = m;
            for (int i = 0; i < w; i++)
            {
                ptr[i] = quantization_value[ index_array[i] ];
            }
        }
        else if (flag_struct.f0 == 0)
        {
            // raw data
            nread = fread(m, w * sizeof(float), 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read weight_data failed %d\n", nread);
                return Mat();
            }
        }

        return m;
    }
    else if (type == 1)
    {
        Mat m(w);
        if (m.empty())
            return m;

        // raw data
        int nread = fread(m, w * sizeof(float), 1, binfp);
        if (nread != 1)
        {
            fprintf(stderr, "ModelBin read weight_data failed %d\n", nread);
            return Mat();
        }

        return m;
    }
    else
    {
        fprintf(stderr, "ModelBin load type %d not implemented\n", type);
        return Mat();
    }

    return Mat();
}